

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.c
# Opt level: O0

void av1_reset_loop_restoration(MACROBLOCKD *xd,int num_planes)

{
  int in_ESI;
  long in_RDI;
  int p;
  undefined4 local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    set_default_wiener((WienerInfo *)(in_RDI + 0x1ff0 + (long)local_10 * 0x20));
    set_default_sgrproj((SgrprojInfo *)(in_RDI + 0x2050 + (long)local_10 * 0xc));
  }
  return;
}

Assistant:

void av1_reset_loop_restoration(MACROBLOCKD *xd, const int num_planes) {
  for (int p = 0; p < num_planes; ++p) {
    set_default_wiener(xd->wiener_info + p);
    set_default_sgrproj(xd->sgrproj_info + p);
  }
}